

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coulombic_energy_compute.cpp
# Opt level: O1

void __thiscall
CoulombicEnergyCompute::particle_cluster_interact
          (CoulombicEnergyCompute *this,array<unsigned_long,_2UL> target_node_idxs,
          size_t source_node_idx)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  uint uVar7;
  int iVar8;
  Molecule *pMVar9;
  double *pdVar10;
  pointer pdVar11;
  pointer pdVar12;
  pointer pdVar13;
  pointer pdVar14;
  InterpolationPoints *pIVar15;
  pointer pdVar16;
  pointer pdVar17;
  pointer pdVar18;
  pointer pdVar19;
  int iVar20;
  pointer pdVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  int k3;
  ulong uVar26;
  ulong uVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  
  uVar24 = target_node_idxs._M_elems[0];
  if (uVar24 < target_node_idxs._M_elems[1]) {
    pMVar9 = this->molecule_;
    pdVar10 = (this->coul_eng_vec_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar11 = (pMVar9->super_Particles).x_.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pdVar12 = (pMVar9->super_Particles).y_.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pdVar13 = (pMVar9->super_Particles).z_.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pdVar14 = (pMVar9->charge_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar7 = this->num_mol_interp_pts_per_node_;
    uVar23 = (ulong)uVar7;
    pIVar15 = this->mol_interp_pts_;
    iVar8 = this->num_mol_interp_charges_per_node_;
    lVar25 = (long)(int)uVar7 * source_node_idx;
    pdVar16 = (pIVar15->interp_x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar17 = (pIVar15->interp_y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar18 = (pIVar15->interp_z_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar19 = (this->mol_interp_charge_).super__Vector_base<double,_std::allocator<double>_>._M_impl
              .super__Vector_impl_data._M_start;
    do {
      dVar1 = pdVar14[uVar24];
      dVar31 = 0.0;
      if (0 < (int)uVar7) {
        dVar2 = pdVar11[uVar24];
        dVar3 = pdVar12[uVar24];
        dVar4 = pdVar13[uVar24];
        iVar20 = 0;
        uVar27 = 0;
        do {
          pdVar21 = pdVar19 + (long)iVar8 * source_node_idx + (long)iVar20;
          uVar22 = 0;
          do {
            uVar26 = 0;
            do {
              dVar29 = dVar2 - pdVar16[lVar25 + uVar27];
              dVar30 = dVar3 - pdVar17[lVar25 + uVar22];
              dVar28 = dVar4 - pdVar18[lVar25 + uVar26];
              dVar5 = pdVar21[uVar26];
              dVar6 = this->eps_solute_;
              dVar28 = dVar28 * dVar28 + dVar29 * dVar29 + dVar30 * dVar30;
              if (dVar28 < 0.0) {
                dVar28 = sqrt(dVar28);
              }
              else {
                dVar28 = SQRT(dVar28);
              }
              dVar31 = dVar31 + (dVar5 / dVar6) / dVar28;
              uVar26 = uVar26 + 1;
            } while (uVar23 != uVar26);
            uVar22 = uVar22 + 1;
            pdVar21 = pdVar21 + uVar23;
          } while (uVar22 != uVar23);
          uVar27 = uVar27 + 1;
          iVar20 = iVar20 + uVar7 * uVar7;
        } while (uVar27 != uVar23);
      }
      *pdVar10 = dVar1 * dVar31 + *pdVar10;
      uVar24 = uVar24 + 1;
    } while (uVar24 != target_node_idxs._M_elems[1]);
  }
  return;
}

Assistant:

void CoulombicEnergyCompute::particle_cluster_interact(std::array<std::size_t, 2> target_node_idxs,
                                                       std::size_t source_node_idx)
{
//    timers_.particle_cluster_interact.start();
    
    /* Targets */
    
    std::size_t target_node_begin          = target_node_idxs[0];
    std::size_t target_node_end            = target_node_idxs[1];
    
    const double* __restrict mol_x_ptr = molecule_.x_ptr();
    const double* __restrict mol_y_ptr = molecule_.y_ptr();
    const double* __restrict mol_z_ptr = molecule_.z_ptr();

    const double* __restrict mol_q_ptr = molecule_.charge_ptr();

    /* Sources */
    
    int num_mol_interp_pts_per_node                 = num_mol_interp_pts_per_node_;
    int num_mol_interp_charges_per_node             = num_mol_interp_charges_per_node_;

    std::size_t source_cluster_interp_pts_begin     = source_node_idx * num_mol_interp_pts_per_node_;
    std::size_t source_cluster_interp_charges_begin = source_node_idx * num_mol_interp_charges_per_node_;
    
    const double* __restrict mol_clusters_x_ptr     = mol_interp_pts_.interp_x_ptr();
    const double* __restrict mol_clusters_y_ptr     = mol_interp_pts_.interp_y_ptr();
    const double* __restrict mol_clusters_z_ptr     = mol_interp_pts_.interp_z_ptr();
    
    const double* __restrict mol_clusters_q_ptr     = mol_interp_charge_.data();

    /* Potential */

    double* __restrict coul_eng_ptr = coul_eng_vec_.data();
    
    
#ifdef OPENACC_ENABLED
    int stream_id = std::rand() % 3;
    #pragma acc parallel loop async(stream_id) present(mol_x_ptr, mol_y_ptr, mol_z_ptr, mol_q_ptr, \
                                      mol_clusters_x_ptr, mol_clusters_y_ptr, mol_clusters_z_ptr, \
                                      mol_clusters_q_ptr, coul_eng_ptr)
#endif
    for (std::size_t j = target_node_begin; j < target_node_end; ++j) {

        double target_x = mol_x_ptr[j];
        double target_y = mol_y_ptr[j];
        double target_z = mol_z_ptr[j];
        double target_q = mol_q_ptr[j];
        
        double pot_temp = 0.;
        
#ifdef OPENACC_ENABLED
        #pragma acc loop collapse(3) reduction(+:pot_temp)
#endif
        for (int k1 = 0; k1 < num_mol_interp_pts_per_node; ++k1) {
        for (int k2 = 0; k2 < num_mol_interp_pts_per_node; ++k2) {
        for (int k3 = 0; k3 < num_mol_interp_pts_per_node; ++k3) {
                
            std::size_t kk = source_cluster_interp_charges_begin
                           + k1 * num_mol_interp_pts_per_node * num_mol_interp_pts_per_node
                           + k2 * num_mol_interp_pts_per_node + k3;

            double dx = target_x - mol_clusters_x_ptr[source_cluster_interp_pts_begin + k1];
            double dy = target_y - mol_clusters_y_ptr[source_cluster_interp_pts_begin + k2];
            double dz = target_z - mol_clusters_z_ptr[source_cluster_interp_pts_begin + k3];

            pot_temp += mol_clusters_q_ptr[kk] / eps_solute_ / std::sqrt(dx*dx + dy*dy + dz*dz);
        }
        }
        }
        
        pot_temp *= target_q;

#ifdef OPENACC_ENABLED
        #pragma acc atomic update
#elif  OPENMP_ENABLED
        #pragma omp atomic update
#endif
        coul_eng_ptr[0] += pot_temp;
    }

//    timers_.particle_cluster_interact.stop();
}